

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_> *
ExprEval::Operator::get_custom_table(void)

{
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this;
  value_type local_198;
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  CustomOperator operator_id;
  string local_d0 [48];
  undefined1 local_a0 [8];
  CustomOperator operator_sqrt;
  
  if (custom_operator_table ==
      (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       *)0x0) {
    this = (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
            *)operator_new(0x18);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::vector(this);
    custom_operator_table = this;
    CustomOperator::CustomOperator((CustomOperator *)local_a0);
    std::__cxx11::string::operator=((string *)&operator_sqrt,"sqrt");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"var",(allocator *)&operator_id.field_0x97);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&operator_sqrt.field_0x20,(value_type *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&operator_id.field_0x97);
    operator_id._144_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &operator_sqrt.variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)&operator_id.field_0x90);
    std::__cxx11::string::operator=
              ((string *)
               &operator_sqrt.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"var^0.5");
    CustomOperator::CustomOperator((CustomOperator *)local_170);
    std::__cxx11::string::operator=((string *)&operator_id,"id");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"x",&local_191);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&operator_id.field_0x20,(value_type *)local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    local_198 = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &operator_id.variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
    std::__cxx11::string::operator=
              ((string *)
               &operator_id.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"x");
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,(value_type *)local_a0);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,(value_type *)local_170);
    CustomOperator::~CustomOperator((CustomOperator *)local_170);
    CustomOperator::~CustomOperator((CustomOperator *)local_a0);
  }
  return custom_operator_table;
}

Assistant:

const std::vector<Operator::CustomOperator>* get_custom_table(){
            if(!custom_operator_table){
                custom_operator_table = new std::vector<Operator::CustomOperator>;

                CustomOperator operator_sqrt;
                operator_sqrt.symbol = "sqrt";
                operator_sqrt.variables.push_back("var");
                operator_sqrt.arg_positions.push_back(1);
                operator_sqrt.expression = "var^0.5";

                CustomOperator operator_id;
                operator_id.symbol = "id";
                operator_id.variables.push_back("x");
                operator_id.arg_positions.push_back(1);
                operator_id.expression = "x";

                custom_operator_table->push_back(operator_sqrt);
                custom_operator_table->push_back(operator_id);
            }
            return custom_operator_table;
        }